

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int rede_add_entry(file_info *file)

{
  bool bVar1;
  file_info *re;
  file_info *file_local;
  int local_4;
  
  re = file->parent;
  while( true ) {
    bVar1 = false;
    if (re != (file_info *)0x0) {
      bVar1 = re->re == '\0';
    }
    if (!bVar1) break;
    re = re->parent;
  }
  if (re == (file_info *)0x0) {
    local_4 = -1;
  }
  else {
    file->re_next = (file_info *)0x0;
    *(re->rede_files).last = file;
    (re->rede_files).last = &file->re_next;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int
rede_add_entry(struct file_info *file)
{
	struct file_info *re;

	/*
	 * Find "RE" entry.
	 */
	re = file->parent;
	while (re != NULL && !re->re)
		re = re->parent;
	if (re == NULL)
		return (-1);

	file->re_next = NULL;
	*re->rede_files.last = file;
	re->rede_files.last = &(file->re_next);
	return (0);
}